

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float *pfVar4;
  float fVar5;
  ImRect IVar6;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  ImGuiAxis axis_local;
  ImGuiWindow *window_local;
  
  IVar6 = ImGuiWindow::Rect(window);
  IVar2 = (window->InnerRect).Min;
  IVar3 = (window->InnerRect).Max;
  fVar5 = window->WindowBorderSize;
  pfVar4 = ImVec2::operator[](&window->ScrollbarSizes,(long)(axis ^ ImGuiAxis_Y));
  fVar1 = *pfVar4;
  if (0.0 < fVar1) {
    if (axis == ImGuiAxis_X) {
      scrollbar_size = IVar2.x;
      inner_rect.Max.y = IVar6.Min.y;
      outer_rect.Min.y = IVar6.Max.y;
      fVar5 = ImMax<float>(inner_rect.Max.y,(outer_rect.Min.y - fVar5) - fVar1);
      inner_rect.Min.x = IVar3.x;
      ImRect::ImRect((ImRect *)&window_local,scrollbar_size,fVar5,inner_rect.Min.x,outer_rect.Min.y)
      ;
    }
    else {
      inner_rect.Max.x = IVar6.Min.x;
      outer_rect.Min.x = IVar6.Max.x;
      fVar5 = ImMax<float>(inner_rect.Max.x,(outer_rect.Min.x - fVar5) - fVar1);
      border_size = IVar2.y;
      inner_rect.Min.y = IVar3.y;
      ImRect::ImRect((ImRect *)&window_local,fVar5,border_size,outer_rect.Min.x,inner_rect.Min.y);
    }
    return _window_local;
  }
  __assert_fail("scrollbar_size > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                ,0x33a,"ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *, ImGuiAxis)");
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}